

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData * cfd::core::HashUtil::Sha512(ByteData *__return_storage_ptr__,Script *script)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  Script::GetData((ByteData *)&_Stack_28,script);
  Sha512(__return_storage_ptr__,(ByteData *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Sha512(const Script &script) {
  return Sha512(script.GetData());
}